

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void number_suite::value_int16(void)

{
  bool bVar1;
  return_type rVar2;
  short sVar3;
  value vVar4;
  int iVar5;
  size_type sVar6;
  float fVar7;
  value_type input [3];
  reader reader;
  ulong local_b8;
  double local_b0 [4];
  uchar local_8c [4];
  reader local_88;
  
  local_8c[2] = '\x01';
  local_8c[0] = 0xb2;
  local_8c[1] = '\0';
  trial::protocol::bintoken::reader::reader<unsigned_char[3]>(&local_88,(uchar (*) [3])local_8c);
  local_b8._0_4_ = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x14f,"void number_suite::value_int16()",local_b0,&local_b8);
  local_b0[0]._0_4_ =
       trial::protocol::bintoken::token::symbol::convert(local_88.decoder.current.code);
  local_b8._0_4_ = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x150,"void number_suite::value_int16()",local_b0,&local_b8);
  vVar4 = trial::protocol::bintoken::token::symbol::convert(local_88.decoder.current.code);
  local_b0[0]._0_4_ = 0;
  if (vVar4 - null < 0xc) {
    local_b0[0]._0_4_ = *(value *)(&DAT_0011edac + (ulong)(vVar4 - null) * 4);
  }
  local_b8 = CONCAT44(local_b8._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x151,"void number_suite::value_int16()",local_b0,&local_b8);
  sVar6 = trial::protocol::bintoken::reader::length(&local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x152,"void number_suite::value_int16()",sVar6 == 1);
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::boolean,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::boolean>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x155,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int8,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x157,"void number_suite::value_int16()");
  rVar2 = trial::protocol::bintoken::reader::
          overloader<trial::protocol::bintoken::token::int16,_void>::convert(&local_88);
  local_b0[0]._0_4_ = 0x100;
  local_b8._0_2_ = rVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("reader.value<token::int16>()","0x100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x158,"void number_suite::value_int16()",&local_b8,local_b0);
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int32,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x15a,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int64,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x15c,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float32,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x15e,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float64,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x160,"void number_suite::value_int16()");
  trial::protocol::bintoken::reader::overloader<signed_char,_void>::convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<std::int8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x163,"void number_suite::value_int16()");
  sVar3 = trial::protocol::bintoken::reader::overloader<short,_void>::convert(&local_88);
  local_b8 = CONCAT62(local_b8._2_6_,sVar3);
  local_b0[0]._0_4_ = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("reader.value<token::int16::type>()","0x100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x164,"void number_suite::value_int16()",&local_b8,local_b0);
  iVar5 = trial::protocol::bintoken::reader::overloader<int,_void>::convert(&local_88);
  local_b0[0] = (double)CONCAT44(local_b0[0]._4_4_,iVar5);
  local_b8 = CONCAT44(local_b8._4_4_,0x100);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<token::int32::type>()","0x100",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x165,"void number_suite::value_int16()",local_b0,&local_b8);
  local_b0[0] = (double)trial::protocol::bintoken::reader::overloader<long,_void>::convert
                                  (&local_88);
  local_b8 = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64::type>()","UINT64_C(0x0100)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x166,"void number_suite::value_int16()",local_b0,&local_b8);
  fVar7 = trial::protocol::bintoken::reader::overloader<float,_void>::convert(&local_88);
  local_b0[0] = (double)CONCAT44(local_b0[0]._4_4_,fVar7);
  local_b8 = CONCAT44(local_b8._4_4_,0x43800000);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("reader.value<token::float32::type>()","256.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x167,"void number_suite::value_int16()",local_b0,&local_b8);
  local_b0[0] = trial::protocol::bintoken::reader::overloader<double,_void>::convert(&local_88);
  local_b8 = 0x4070000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<token::float64::type>()","256.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x168,"void number_suite::value_int16()",local_b0,&local_b8);
  bVar1 = trial::protocol::bintoken::reader::next(&local_88);
  local_b0[0] = (double)CONCAT71(local_b0[0]._1_7_,bVar1);
  local_b8 = local_b8 & 0xffffffffffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x169,"void number_suite::value_int16()",local_b0,&local_b8);
  local_b0[0] = (double)CONCAT44(local_b0[0]._4_4_,local_88.decoder.current.code);
  local_b8 = local_b8 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x16a,"void number_suite::value_int16()",local_b0,&local_b8);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_88.stack);
  return;
}

Assistant:

void value_int16()
{
    const value_type input[] = { token::code::int16, 0x00, 0x01 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::boolean>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int16>(), 0x100);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int64>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int16::type>(), 0x100);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int32::type>(), 0x100);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64::type>(), UINT64_C(0x0100));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float32::type>(), 256.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float64::type>(), 256.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}